

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O2

Data * __thiscall
QTzTimeZonePrivate::nextTransition
          (Data *__return_storage_ptr__,QTzTimeZonePrivate *this,qint64 afterMSecsSinceEpoch)

{
  undefined8 uVar1;
  undefined1 uVar2;
  ulong uVar3;
  QTzTransitionTime *pQVar4;
  undefined1 *puVar5;
  ulong uVar6;
  Data *pDVar7;
  undefined1 *puVar8;
  QTzTransitionTime *pQVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  QTzTransitionTime tran;
  QArrayDataPointer<QTimeZonePrivate::Data> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->cached_data).m_posixRule.d.size == 0) {
    pQVar9 = (this->cached_data).m_tranTimes.d.ptr;
    uVar3 = (this->cached_data).m_tranTimes.d.size;
    uVar6 = uVar3;
    pQVar4 = pQVar9;
LAB_003b47b0:
    while (uVar10 = uVar6, 0 < (long)uVar10) {
      uVar6 = uVar10 >> 1;
      if (pQVar9[uVar6].atMSecsSinceEpoch <= afterMSecsSinceEpoch) {
        pQVar9 = pQVar9 + uVar6 + 1;
        uVar6 = ~uVar6 + uVar10;
      }
    }
    if (pQVar9 != pQVar4 + uVar3) {
      uVar1 = pQVar9->atMSecsSinceEpoch;
      uVar2 = pQVar9->ruleIndex;
      tran.ruleIndex = uVar2;
      tran.atMSecsSinceEpoch = uVar1;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        tran._9_7_ = 0;
        dataForTzTransition(__return_storage_ptr__,this,tran);
        return __return_storage_ptr__;
      }
      goto LAB_003b487a;
    }
    (__return_storage_ptr__->abbreviation).d.d = (Data *)0x0;
    (__return_storage_ptr__->abbreviation).d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->abbreviation).d.size = 0;
    __return_storage_ptr__->atMSecsSinceEpoch = -0x8000000000000000;
    __return_storage_ptr__->offsetFromUtc = -0x80000000;
    __return_storage_ptr__->standardTimeOffset = -0x80000000;
    __return_storage_ptr__->daylightTimeOffset = -0x80000000;
  }
  else {
    uVar3 = (this->cached_data).m_tranTimes.d.size;
    if ((uVar3 != 0) &&
       (pQVar9 = (this->cached_data).m_tranTimes.d.ptr, uVar6 = uVar3, pQVar4 = pQVar9,
       afterMSecsSinceEpoch <= pQVar9[uVar3 - 1].atMSecsSinceEpoch)) goto LAB_003b47b0;
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    getPosixTransitions((QList<QTimeZonePrivate::Data> *)&local_48,this,afterMSecsSinceEpoch);
    pDVar7 = local_48.ptr;
    puVar5 = (undefined1 *)local_48.size;
    while (puVar8 = puVar5, 0 < (long)puVar8) {
      puVar5 = (undefined1 *)((ulong)puVar8 >> 1);
      if (pDVar7[(long)puVar5].atMSecsSinceEpoch <= afterMSecsSinceEpoch) {
        pDVar7 = pDVar7 + (long)(puVar5 + 1);
        puVar5 = puVar8 + ~(ulong)puVar5;
      }
    }
    if (pDVar7 == local_48.ptr + local_48.size) {
      (__return_storage_ptr__->abbreviation).d.d = (Data *)0x0;
      (__return_storage_ptr__->abbreviation).d.ptr = (char16_t *)0x0;
      (__return_storage_ptr__->abbreviation).d.size = 0;
      __return_storage_ptr__->atMSecsSinceEpoch = -0x8000000000000000;
      __return_storage_ptr__->offsetFromUtc = -0x80000000;
      __return_storage_ptr__->standardTimeOffset = -0x80000000;
      __return_storage_ptr__->daylightTimeOffset = -0x80000000;
    }
    else {
      QTimeZonePrivate::Data::Data(__return_storage_ptr__,pDVar7);
    }
    QArrayDataPointer<QTimeZonePrivate::Data>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
LAB_003b487a:
  __stack_chk_fail();
}

Assistant:

QTimeZonePrivate::Data QTzTimeZonePrivate::nextTransition(qint64 afterMSecsSinceEpoch) const
{
    // If the required time is after the last transition (or there were none)
    // and we have a POSIX rule, then use it:
    if (!cached_data.m_posixRule.isEmpty()
        && (tranCache().isEmpty() || tranCache().last().atMSecsSinceEpoch < afterMSecsSinceEpoch)) {
        QList<Data> posixTrans = getPosixTransitions(afterMSecsSinceEpoch);
        auto it = std::partition_point(posixTrans.cbegin(), posixTrans.cend(),
                                       [afterMSecsSinceEpoch] (const Data &at) {
                                           return at.atMSecsSinceEpoch <= afterMSecsSinceEpoch;
                                       });

        return it == posixTrans.cend() ? Data{} : *it;
    }

    // Otherwise, if we can find a valid tran, use its rule:
    auto last = std::partition_point(tranCache().cbegin(), tranCache().cend(),
                                     [afterMSecsSinceEpoch] (QTzTransitionTime at) {
                                         return at.atMSecsSinceEpoch <= afterMSecsSinceEpoch;
                                     });
    return last != tranCache().cend() ? dataForTzTransition(*last) : Data{};
}